

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase273::run(TestCase273 *this)

{
  Promise<void> *pPVar1;
  Promise<void> local_b0;
  Promise<void> local_a0;
  Type local_90;
  Promise<void> local_88;
  undefined1 local_78 [8];
  Promise<void> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase273 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  Promise<void>::Promise((Promise<void> *)local_78,(void *)0x0);
  local_90.promise = (Promise<void> *)local_78;
  evalLater<kj::(anonymous_namespace)::TestCase273::run()::__0>((kj *)&local_88,&local_90);
  Promise<void>::operator=((Promise<void> *)local_78,&local_88);
  Promise<void>::~Promise(&local_88);
  pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_78);
  Promise<void>::Promise(&local_b0,pPVar1);
  makeChain2((anon_unknown_0 *)&local_a0,1000,&local_b0);
  Promise<void>::operator=((Promise<void> *)local_78,&local_a0);
  Promise<void>::~Promise(&local_a0);
  Promise<void>::~Promise(&local_b0);
  Promise<void>::wait((Promise<void> *)local_78,local_58);
  Promise<void>::~Promise((Promise<void> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, DeepChain4) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  promise = makeChain2(1000, kj::mv(promise));

  promise.wait(waitScope);
}